

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

void Gia_ManResubTest3_(void)

{
  uint uVar1;
  Gia_ResbMan_t *p;
  Vec_Ptr_t *vDivs;
  void **__ptr;
  uint uVar2;
  ulong uVar3;
  word *pwVar4;
  word Divs [6];
  word Truth;
  
  pwVar4 = Divs;
  p = Gia_ResbAlloc(1);
  Divs[0] = 0;
  Divs[1] = 0;
  Divs[2] = 0xaaaaaaaaaaaaaaaa;
  Divs[3] = 0xcccccccccccccccc;
  Divs[4] = 0xf0f0f0f0f0f0f0f0;
  Divs[5] = 0xff00ff00ff00ff00;
  vDivs = (Vec_Ptr_t *)malloc(0x10);
  vDivs->nCap = 8;
  vDivs->nSize = 0;
  __ptr = (void **)malloc(0x40);
  vDivs->pArray = __ptr;
  uVar2 = 8;
  uVar3 = 0;
  do {
    if (uVar3 == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (__ptr == (void **)0x0) {
          __ptr = (void **)malloc(0x80);
        }
        else {
          __ptr = (void **)realloc(__ptr,0x80);
        }
        uVar2 = 0x10;
      }
      else {
        uVar1 = uVar2 * 2;
        if (SBORROW4(uVar2,uVar1) != 0 < (int)uVar2) {
          uVar2 = uVar1;
          if (__ptr == (void **)0x0) {
            __ptr = (void **)malloc((ulong)uVar1 << 3);
          }
          else {
            __ptr = (void **)realloc(__ptr,(ulong)uVar1 << 3);
          }
        }
      }
    }
    __ptr[uVar3] = pwVar4;
    uVar3 = uVar3 + 1;
    pwVar4 = (word *)((long)pwVar4 + 8);
  } while (uVar3 != 6);
  vDivs->nSize = 6;
  vDivs->nCap = uVar2;
  vDivs->pArray = __ptr;
  Divs[1] = (Divs[3] | Divs[2]) & Divs[4] & Divs[5];
  Divs[0] = ~Divs[1];
  Truth = Divs[1];
  Extra_PrintHex(_stdout,(uint *)&Truth,6);
  putchar(0x20);
  Dau_DsdPrintFromTruth2(&Truth,6);
  printf("       ");
  Gia_ManResubPerform(p,vDivs,1,100,0,0x32,1,1,0);
  Gia_ResbFree(p);
  if (vDivs->pArray != (void **)0x0) {
    free(vDivs->pArray);
    vDivs->pArray = (void **)0x0;
  }
  free(vDivs);
  return;
}

Assistant:

void Gia_ManResubTest3_()
{
    Gia_ResbMan_t * p = Gia_ResbAlloc( 1 );
    word Divs[6] = { 0, 0, 
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00) 
    };
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( 6 );
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    int i; 
    for ( i = 0; i < 6; i++ )
        Vec_PtrPush( vDivs, Divs+i );

    {
        word Truth = (Divs[2] | Divs[3]) & (Divs[4] & Divs[5]);
//        word Truth = (~Divs[2] | Divs[3]) | ~Divs[4];
        Divs[0] = ~Truth;
        Divs[1] =  Truth;
        Extra_PrintHex( stdout, (unsigned*)&Truth, 6 );
        printf( " " );
        Dau_DsdPrintFromTruth2( &Truth, 6 );
        printf( "       " );
        Gia_ManResubPerform( p, vDivs, 1, 100, 0, 50, 1, 1, 0 );
    }
    Gia_ResbFree( p );
    Vec_IntFree( vRes );
    Vec_PtrFree( vDivs );
}